

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O3

bool __thiscall SQTable::Get(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  _HashNode *p_Var5;
  SQObjectValue *pSVar6;
  SQTable *pSVar7;
  
  SVar3 = (key->super_SQObject)._type;
  if ((int)SVar3 < 0x5000002) {
    if (SVar3 == OT_NULL) {
      return false;
    }
    if (SVar3 == OT_BOOL) goto LAB_0011f03b;
  }
  else {
    if (SVar3 == OT_INTEGER) {
LAB_0011f03b:
      pSVar4 = (SQTable *)(key->super_SQObject)._unVal.nInteger;
      pSVar7 = pSVar4;
      goto LAB_0011f05b;
    }
    if (SVar3 == OT_FLOAT) {
      pSVar4 = (key->super_SQObject)._unVal.pTable;
      pSVar7 = (SQTable *)(long)(key->super_SQObject)._unVal.fFloat;
      goto LAB_0011f05b;
    }
    if (SVar3 == OT_STRING) {
      pSVar4 = (SQTable *)(key->super_SQObject)._unVal.pString;
      pSVar7 = (pSVar4->super_SQDelegable)._delegate;
      goto LAB_0011f05b;
    }
  }
  pSVar4 = (SQTable *)(key->super_SQObject)._unVal.nInteger;
  pSVar7 = (SQTable *)((long)pSVar4 >> 3);
LAB_0011f05b:
  p_Var5 = this->_nodes + (this->_numofnodes - 1U & (ulong)pSVar7);
  while (((p_Var5->key).super_SQObject._unVal.pTable != pSVar4 ||
         ((p_Var5->key).super_SQObject._type != SVar3))) {
    p_Var5 = p_Var5->next;
    if (p_Var5 == (_HashNode *)0x0) {
      return false;
    }
  }
  SVar3 = (p_Var5->val).super_SQObject._type;
  pSVar6 = &(p_Var5->val).super_SQObject._unVal;
  if (SVar3 == OT_WEAKREF) {
    SVar3 = *(SQObjectType *)&pSVar6->pString->_sharedstate;
    pSVar6 = (SQObjectValue *)&pSVar6->pString->_next;
  }
  pSVar4 = pSVar6->pTable;
  SVar2 = (val->super_SQObject)._type;
  pSVar7 = (val->super_SQObject)._unVal.pTable;
  (val->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)pSVar4;
  (val->super_SQObject)._type = SVar3;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool SQTable::Get(const SQObjectPtr &key,SQObjectPtr &val)
{
    if(sq_type(key) == OT_NULL)
        return false;
    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        val = _realval(n->val);
        return true;
    }
    return false;
}